

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O1

objc_slot * objc_msg_lookup_sender(id *receiver,SEL selector,id sender)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  uintptr_t addr;
  objc_slot *poVar4;
  id poVar5;
  objc_slot *unaff_R14;
  
  poVar5 = *receiver;
  if (poVar5 != (id)0x0) {
    if (((ulong)poVar5 & 7) != 0) {
      poVar5 = (id)((long)SmallObjectClasses + (ulong)(uint)((int)((ulong)poVar5 & 7) << 3));
    }
    uVar2 = *poVar5->isa->dtable;
    poVar4 = (objc_slot *)
             (*(code *)(&DAT_00121af0 +
                       *(int *)(&DAT_00121af0 + (ulong)(uVar2 << 0x1d | uVar2 >> 3) * 4)))
                       (receiver,&DAT_00121af0,
                        &DAT_00121af0 +
                        *(int *)(&DAT_00121af0 + (ulong)(uVar2 << 0x1d | uVar2 >> 3) * 4),
                        (selector->field_0).name);
    return poVar4;
  }
  if (selector->types == (char *)0x0) goto LAB_0011608a;
  cVar1 = *selector->types;
  if (cVar1 == 'D') {
    bVar3 = false;
    unaff_R14 = &nil_slot_D_v1;
  }
  else {
    if (cVar1 == 'f') {
      unaff_R14 = &nil_slot_f_v1;
    }
    else {
      if (cVar1 != 'd') {
        bVar3 = true;
        goto LAB_00116175;
      }
      unaff_R14 = &nil_slot_d_v1;
    }
    bVar3 = false;
  }
LAB_00116175:
  if (!bVar3) {
    return unaff_R14;
  }
LAB_0011608a:
  return &nil_slot_v1;
}

Assistant:

struct objc_slot *objc_msg_lookup_sender(id *receiver, SEL selector, id sender)
{
	// Returning a nil slot allows the caller to cache the lookup for nil too,
	// although this is not particularly useful because the nil method can be
	// inlined trivially.
	if (UNLIKELY(*receiver == nil))
	{
		// Return the correct kind of zero, depending on the type encoding.
		if (selector->types)
		{
			const char *t = selector->types;
			// Skip type qualifiers
			while ('r' == *t || 'n' == *t || 'N' == *t || 'o' == *t ||
			       'O' == *t || 'R' == *t || 'V' == *t || 'A' == *t)
			{
				t++;
			}
			switch (selector->types[0])
			{
				case 'D': return &nil_slot_D_v1;
				case 'd': return &nil_slot_d_v1;
				case 'f': return &nil_slot_f_v1;
			}
		}
		return &nil_slot_v1;
	}

	struct objc_slot2 *slot = objc_msg_lookup_internal(receiver, selector, NULL);
	uncacheable_slot_v1.owner = Nil;
	uncacheable_slot_v1.types = sel_getType_np(((struct objc_method*)slot)->selector);
	uncacheable_slot_v1.selector = selector;
	uncacheable_slot_v1.method = slot->method;
	return &uncacheable_slot_v1;
}